

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O3

Am_Value * __thiscall
Formula_Context::Get
          (Formula_Context *this,Am_Object_Advanced *object,Am_Slot_Key key,Am_Slot_Flags flags)

{
  Formula_Constraint *context;
  bool bVar1;
  Am_Slot_Key AVar2;
  int iVar3;
  undefined4 extraout_var;
  Dependency *pDVar4;
  Am_Constraint_Tag pvVar5;
  Am_Value *pAVar6;
  Dependency **ppDVar7;
  Am_Slot slot;
  Am_Slot local_30;
  Am_Object local_28;
  
  if ((flags & 4) != 0) {
    iVar3 = (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[1])
                      (Am_Empty_Constraint_Context,object,(ulong)key);
    return (Am_Value *)CONCAT44(extraout_var,iVar3);
  }
  local_30.data = (Am_Slot_Data *)0x0;
  if ((this->current_position == (Dependency *)0x0) ||
     (local_30.data = (this->current_position->depended).data, local_30.data == (Am_Slot_Data *)0x0)
     ) {
LAB_001c7401:
    local_30 = Am_Object_Advanced::Get_Slot(object,key);
    pDVar4 = this->current_position;
    if (pDVar4 == (Dependency *)0x0) {
      pDVar4 = (Dependency *)Dyn_Memory_Manager::New(&Dependency::memory);
      pDVar4->dependency_tag = (Am_Constraint_Tag)0x0;
      pDVar4->next = (Dependency *)0x0;
      (pDVar4->depended).data = local_30.data;
      pvVar5 = Am_Slot::Add_Dependency(&local_30,(Am_Constraint *)this->context);
      pDVar4->dependency_tag = pvVar5;
      pDVar4->next = (Dependency *)0x0;
      ppDVar7 = &this->last_position->next;
      if (this->last_position == (Dependency *)0x0) {
        ppDVar7 = &this->context->depends_on;
      }
      *ppDVar7 = pDVar4;
      this->last_position = pDVar4;
      goto LAB_001c749a;
    }
    context = this->context;
    context->internal_remove = true;
    Dependency::Move_Back_Dep(pDVar4,&local_30,(Am_Constraint *)context);
    this->context->internal_remove = false;
  }
  else {
    Am_Slot::Get_Owner((Am_Slot *)&local_28);
    bVar1 = Am_Object::operator==(&local_28,&object->super_Am_Object);
    if (!bVar1) {
      Am_Object::~Am_Object(&local_28);
      goto LAB_001c7401;
    }
    AVar2 = Am_Slot::Get_Key(&local_30);
    Am_Object::~Am_Object(&local_28);
    if (AVar2 != key) goto LAB_001c7401;
  }
  this->last_position = this->current_position;
  this->current_position = this->current_position->next;
LAB_001c749a:
  Am_Slot::Validate(&local_30);
  pAVar6 = Am_Slot::Get(&local_30);
  return pAVar6;
}

Assistant:

const Am_Value &
Formula_Context::Get(const Am_Object_Advanced &object, Am_Slot_Key key,
                     Am_Slot_Flags flags)
{
  if (flags & Am_NO_DEPENDENCY)
    return Am_Empty_Constraint_Context->Get(object, key, flags);

  Am_Slot slot;

  if (current_position) {
    slot = current_position->depended;
    if (slot && (slot.Get_Owner() == object) && (slot.Get_Key() == key)) {
      last_position = current_position;
      current_position = current_position->next;
      slot.Validate();
      return slot.Get();
    }
  }
  slot = object.Get_Slot(key);
  if (current_position) {
    context->internal_remove = true;
    current_position->Move_Back_Dep(slot, context);
    context->internal_remove = false;
    last_position = current_position;
    current_position = current_position->next;
  } else {
    Dependency *new_dep = new Dependency();

    new_dep->depended = slot;
    new_dep->dependency_tag = slot.Add_Dependency(context);
    new_dep->next = nullptr;
    if (last_position)
      last_position->next = new_dep;
    else
      context->depends_on = new_dep;
    last_position = new_dep;
  }

  slot.Validate();
  return slot.Get();
}